

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O1

void __thiscall
LSL_RLEZ<UF>::PerformLabelingMem
          (LSL_RLEZ<UF> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  Mat *m;
  Mat1b *pMVar4;
  pointer puVar5;
  pointer puVar6;
  pointer piVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar8;
  undefined1 auVar9 [8];
  undefined1 auVar10 [8];
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  double dVar25;
  MemVector<int> ner;
  MemMat<int> ERA;
  MemMat<int> RLC;
  MemMat<int> ER;
  MemMat<int> labels;
  MemMat<int> img;
  MemVector<int> local_540;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_510;
  long *local_508;
  long local_500;
  long *local_4f8;
  undefined4 local_4f0;
  Mat *local_4e8;
  undefined8 local_4e0;
  undefined1 local_4d8 [8];
  void *pvStack_4d0;
  Size local_4c8;
  undefined1 local_478 [104];
  Mat local_410 [16];
  long local_400;
  long *local_3c8;
  undefined1 local_3b0 [104];
  Mat local_348 [16];
  long local_338;
  long *local_300;
  undefined1 local_2e8 [104];
  Mat local_280 [16];
  long local_270;
  long *local_238;
  undefined1 local_220 [104];
  Mat local_1b8 [16];
  long local_1a8;
  long *local_170;
  undefined1 local_158 [104];
  Mat local_f0 [16];
  long local_e0;
  long *local_a8;
  Mat_<int> local_90;
  
  m = &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat;
  uVar2 = *(uint *)(m + 8);
  uVar17 = (ulong)uVar2;
  uVar3 = *(uint *)(m + 0xc);
  cv::Mat::Mat(&local_90.super_Mat);
  local_90._0_4_ = local_90._0_4_ & 0xfffff000 | 4;
  cv::Mat_<int>::operator=((Mat_<int> *)&local_90.super_Mat,m);
  MemMat<int>::MemMat((MemMat<int> *)local_158,&local_90);
  cv::Mat::~Mat(&local_90.super_Mat);
  local_3b0._0_4_ = uVar3;
  local_3b0._4_4_ = uVar2;
  MemMat<int>::MemMat((MemMat<int> *)local_2e8,(Size *)local_3b0);
  local_478._0_4_ = uVar3 + 1 & 0xfffffffe;
  local_478._4_4_ = uVar2;
  MemMat<int>::MemMat((MemMat<int> *)local_3b0,(Size *)local_478);
  local_510 = accesses;
  MemVector<int>::MemVector(&local_540,(long)(int)uVar2);
  if (0 < (int)uVar2) {
    local_4f8 = local_300;
    local_500 = local_3b0._24_8_;
    local_508 = (long *)local_3b0._80_8_;
    uVar18 = 0;
    do {
      uVar14 = 0;
      iVar11 = 0;
      if (0 < (int)uVar3) {
        lVar21 = *local_238;
        lVar22 = *(long *)local_2e8._80_8_;
        lVar19 = *(long *)local_158._80_8_;
        lVar15 = *local_a8;
        uVar24 = 0;
        iVar11 = 0;
        uVar13 = 0;
        do {
          piVar1 = (int *)(lVar15 * uVar18 + local_e0 + uVar24 * 4);
          *piVar1 = *piVar1 + 1;
          uVar14 = (uint)(0 < *(int *)(lVar19 * uVar18 + local_158._24_8_ + uVar24 * 4));
          if (uVar13 != uVar14) {
            piVar1 = (int *)(*local_300 * uVar18 + local_338 + (long)iVar11 * 4);
            *piVar1 = *piVar1 + 1;
            *(int *)(*(long *)local_3b0._80_8_ * uVar18 + local_3b0._24_8_ + (long)iVar11 * 4) =
                 (int)uVar24;
            iVar11 = iVar11 + 1;
          }
          piVar1 = (int *)(lVar21 * uVar18 + local_270 + uVar24 * 4);
          *piVar1 = *piVar1 + 1;
          *(int *)(lVar22 * uVar18 + local_2e8._24_8_ + uVar24 * 4) = iVar11;
          uVar24 = uVar24 + 1;
          uVar13 = uVar14;
        } while (uVar3 != uVar24);
      }
      if (uVar14 != 0) {
        piVar1 = (int *)(*local_300 * uVar18 + local_338 + (long)iVar11 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)local_3b0._80_8_ * uVar18 + local_3b0._24_8_ + (long)iVar11 * 4) = uVar3;
      }
      local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar18] =
           local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar18] + 1;
      local_540.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar18] = iVar11 + uVar14;
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar17);
  }
  local_220._0_4_ = uVar3 + 1;
  local_220._4_4_ = uVar2;
  MemMat<int>::MemMat((MemMat<int> *)local_478,(Size *)local_220,0);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar11 = *(int *)&pMVar4->field_0x8;
  iVar12 = *(int *)&pMVar4->field_0xc;
  UF::MemAlloc(((iVar12 - (iVar12 + 1 >> 0x1f)) + 1 >> 1) *
               ((iVar11 - (iVar11 + 1 >> 0x1f)) + 1 >> 1) + 1);
  piVar7 = UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  puVar6 = UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  UF::length_ = 1;
  *local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
   ._M_start = *local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
  if (0 < *local_540.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start) {
    lVar21 = 1;
    do {
      uVar14 = UF::length_;
      lVar22 = (long)(int)UF::length_;
      piVar7[lVar22] = piVar7[lVar22] + 1;
      puVar6[lVar22] = uVar14;
      uVar14 = UF::length_;
      UF::length_ = UF::length_ + 1;
      piVar1 = (int *)(local_400 + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_478._24_8_ + lVar21 * 4) = uVar14;
      *local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start =
           *local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + 1;
      lVar21 = lVar21 + 2;
    } while (lVar21 <= *local_540.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
  }
  if (1 < (int)uVar2) {
    uVar18 = 1;
    lVar21 = 0;
    do {
      local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar18] =
           local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar18] + 1;
      if (0 < local_540.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar18]) {
        lVar22 = uVar18 - 1;
        lVar19 = 1;
        do {
          lVar15 = *local_300 * uVar18 + local_338;
          piVar1 = (int *)(lVar15 + -4 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          lVar16 = *(long *)local_3b0._80_8_ * uVar18 + local_3b0._24_8_;
          iVar11 = *(int *)(lVar16 + -4 + lVar19 * 4);
          piVar1 = (int *)(lVar15 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          iVar12 = *(int *)(lVar16 + lVar19 * 4);
          lVar20 = *local_238 * lVar22 + local_270;
          lVar15 = (long)(int)(iVar11 - (uint)(0 < iVar11));
          piVar1 = (int *)(lVar20 + lVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar16 = *(long *)local_2e8._80_8_ * lVar22 + local_2e8._24_8_;
          iVar11 = *(int *)(lVar16 + lVar15 * 4);
          lVar15 = (long)(int)(iVar12 - (uint)((int)uVar3 <= iVar12));
          piVar1 = (int *)(lVar20 + lVar15 * 4);
          *piVar1 = *piVar1 + 1;
          uVar13 = UF::length_;
          uVar14 = *(uint *)(lVar16 + lVar15 * 4);
          uVar24 = (long)iVar11 | 1;
          iVar11 = uVar14 + (uVar14 & 1) + -1;
          if (iVar11 < (int)uVar24) {
            lVar15 = (long)(int)UF::length_;
            UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15] =
                 UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15] + 1;
            UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15] = uVar13;
            uVar14 = UF::length_;
            UF::length_ = UF::length_ + 1;
          }
          else {
            piVar1 = (int *)(*local_3c8 * lVar22 + local_400 + uVar24 * 4);
            *piVar1 = *piVar1 + 1;
            uVar14 = UF::MemFindRoot(*(uint *)(*(long *)local_478._80_8_ * lVar22 + local_478._24_8_
                                              + uVar24 * 4));
            iVar12 = (int)uVar24 + 2;
            if (iVar12 <= iVar11) {
              lVar15 = (long)iVar12;
              do {
                piVar1 = (int *)(*local_3c8 * lVar21 + local_400 + lVar15 * 4);
                *piVar1 = *piVar1 + 1;
                uVar13 = UF::MemFindRoot(*(uint *)(*(long *)local_478._80_8_ * lVar21 +
                                                   local_478._24_8_ + lVar15 * 4));
                if ((int)uVar14 < (int)uVar13) {
                  UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar13] =
                       UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar13] + 1;
                  UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[(int)uVar13] = uVar14;
                }
                if ((int)uVar13 < (int)uVar14) {
                  UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar14] =
                       UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar14] + 1;
                  UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[(int)uVar14] = uVar13;
                  uVar14 = uVar13;
                }
                lVar15 = lVar15 + 2;
              } while (lVar15 <= iVar11);
            }
          }
          piVar1 = (int *)(*local_3c8 * uVar18 + local_400 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)local_478._80_8_ * uVar18 + local_478._24_8_ + lVar19 * 4) = uVar14;
          local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar18] =
               local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar18] + 1;
          lVar19 = lVar19 + 2;
        } while (lVar19 <= local_540.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar18]);
      }
      uVar18 = uVar18 + 1;
      lVar21 = lVar21 + 1;
    } while (uVar18 != uVar17);
  }
  uVar14 = UF::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar14;
  local_4d8._4_4_ = uVar2;
  local_4d8._0_4_ = uVar3;
  MemMat<int>::MemMat((MemMat<int> *)local_220,(Size *)local_4d8);
  piVar7 = UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)uVar2) {
    uVar18 = 0;
    do {
      if (0 < (int)uVar3) {
        lVar21 = *local_3c8;
        lVar22 = *(long *)local_478._80_8_;
        lVar19 = *local_170;
        lVar15 = *(long *)local_220._80_8_;
        lVar16 = *(long *)local_2e8._80_8_;
        lVar20 = *local_238;
        uVar24 = 0;
        do {
          piVar1 = (int *)(lVar20 * uVar18 + local_270 + uVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar23 = (long)*(int *)(lVar16 * uVar18 + local_2e8._24_8_ + uVar24 * 4);
          piVar1 = (int *)(lVar21 * uVar18 + local_400 + lVar23 * 4);
          *piVar1 = *piVar1 + 1;
          iVar11 = *(int *)(lVar22 * uVar18 + local_478._24_8_ + lVar23 * 4);
          piVar7[iVar11] = piVar7[iVar11] + 1;
          uVar2 = puVar6[iVar11];
          piVar1 = (int *)(lVar19 * uVar18 + local_1a8 + uVar24 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(lVar15 * uVar18 + local_220._24_8_ + uVar24 * 4) = uVar2;
          uVar24 = uVar24 + 1;
        } while (uVar3 != uVar24);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar17);
  }
  local_4d8._0_4_ = 0;
  local_4d8._4_4_ = 0;
  pvStack_4d0 = (void *)0x0;
  local_4c8.width = 0;
  local_4c8.height = 0;
  local_4d8 = (undefined1  [8])operator_new(0x20);
  pvVar8 = local_510;
  pvStack_4d0 = (void *)((long)local_4d8 + 0x20);
  *(undefined8 *)((long)local_4d8 + 0x10) = 0;
  *(undefined8 *)((long)local_4d8 + 0x18) = 0;
  *(undefined8 *)local_4d8 = 0;
  *(undefined8 *)((long)local_4d8 + 8) = 0;
  local_4c8 = (Size)pvStack_4d0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_510,local_4d8);
  if ((Size)local_4d8 != (Size)0x0) {
    operator_delete((void *)local_4d8,(long)local_4c8 - (long)local_4d8);
  }
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_f0;
  cv::sum((_InputArray *)local_4d8);
  *(pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_4d8 - 9.223372036854776e+18) & (long)(double)local_4d8 >> 0x3f |
       (long)(double)local_4d8;
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_1b8;
  cv::sum((_InputArray *)local_4d8);
  puVar5 = (pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5[1] = (long)((double)local_4d8 - 9.223372036854776e+18) & (long)(double)local_4d8 >> 0x3f |
              (long)(double)local_4d8;
  if ((long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar17 = 0;
  }
  else {
    lVar21 = (long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar25 = 0.0;
    lVar22 = 0;
    do {
      dVar25 = dVar25 + (double)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar22];
      lVar22 = lVar22 + 1;
    } while (lVar21 + (ulong)(lVar21 == 0) != lVar22);
    uVar17 = (long)(dVar25 - 9.223372036854776e+18) & (long)dVar25 >> 0x3f | (long)dVar25;
  }
  puVar5[2] = uVar17;
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_280;
  cv::sum((_InputArray *)local_4d8);
  auVar9 = local_4d8;
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_348;
  cv::sum((_InputArray *)local_4d8);
  auVar10 = local_4d8;
  if ((long)local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    dVar25 = 0.0;
  }
  else {
    lVar21 = (long)local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar25 = 0.0;
    lVar22 = 0;
    do {
      dVar25 = dVar25 + (double)local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar22];
      lVar22 = lVar22 + 1;
    } while (lVar21 + (ulong)(lVar21 == 0) != lVar22);
  }
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_410;
  cv::sum((_InputArray *)local_4d8);
  dVar25 = (double)auVar9 + (double)auVar10 + dVar25 + (double)local_4d8;
  uVar17 = (ulong)dVar25;
  (pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[3] =
       (long)(dVar25 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17;
  MemMat<int>::GetImage((Mat_<int> *)local_4d8,(MemMat<int> *)local_220);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     (Mat *)local_4d8);
  cv::Mat::~Mat((Mat *)local_4d8);
  cv::Mat::~Mat(local_1b8);
  cv::Mat::~Mat((Mat *)(local_220 + 8));
  cv::Mat::~Mat(local_410);
  cv::Mat::~Mat((Mat *)(local_478 + 8));
  if (local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (int *)0x0) {
    operator_delete(local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_540.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_540.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_540.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_540.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cv::Mat::~Mat(local_348);
  cv::Mat::~Mat((Mat *)(local_3b0 + 8));
  cv::Mat::~Mat(local_280);
  cv::Mat::~Mat((Mat *)(local_2e8 + 8));
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat((Mat *)(local_158 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses) {
        int rows = img_.rows;
        int cols = img_.cols;

        MemMat<int> img(img_);

        // Step 1
        MemMat<int> ER(rows, cols);   // Matrix of relative label (1 label/pixel) 
        MemMat<int> RLC(rows, (cols + 1) & ~1); // MISSING in the paper: RLC requires 2 values/run in row, so width must be next multiple of 2
        MemVector<int> ner(rows); //vector<int> ner(rows); // Number of runs 

        for (int r = 0; r < rows; ++r) {
            int x0;
            int x1 = 0; // Previous value of X
            int f = 0;  // Front detection
            ZOA_MOD0
            int er = 0;
            for (int c = 0; c < cols; ++c)
            {
                x0 = img(r, c) > 0;
                f = x0 ^ x1;
                RLE_MOD1{
                    RLC(r, er) = c ZOA_MOD1;
                    ZOA_MOD2
                        er = er + RLE_MOD2;
                }
                ER(r, c) = er;
                x1 = x0;
            }
            ZOA_MOD3
                RLC(r, er) = cols ZOA_MOD1;
            ZOA_MOD4
                ner[r] = er;
        }